

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void mp_rshift_fixed_into(mp_int *r,mp_int *a,size_t bits)

{
  ulong uVar1;
  byte bVar2;
  BignumInt BVar3;
  ulong *puVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  
  sVar5 = r->nw;
  if (sVar5 != 0) {
    uVar6 = bits >> 6;
    bVar2 = (byte)bits & 0x3f;
    uVar1 = a->nw;
    puVar4 = r->w;
    do {
      if (uVar6 < uVar1) {
        BVar3 = a->w[uVar6];
      }
      else {
        BVar3 = 0;
      }
      *puVar4 = BVar3;
      if ((bits & 0x3f) != 0) {
        uVar7 = BVar3 >> bVar2;
        *puVar4 = uVar7;
        if (uVar6 + 1 < uVar1) {
          BVar3 = a->w[uVar6 + 1];
        }
        else {
          BVar3 = 0;
        }
        *puVar4 = BVar3 << (0x40 - bVar2 & 0x3f) | uVar7;
      }
      puVar4 = puVar4 + 1;
      uVar6 = uVar6 + 1;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  return;
}

Assistant:

void mp_rshift_fixed_into(mp_int *r, mp_int *a, size_t bits)
{
    size_t words = bits / BIGNUM_INT_BITS;
    size_t bitoff = bits % BIGNUM_INT_BITS;

    for (size_t i = 0; i < r->nw; i++) {
        r->w[i] = mp_word(a, i + words);
        if (bitoff != 0) {
            r->w[i] >>= bitoff;
            r->w[i] |= mp_word(a, i + words + 1) << (BIGNUM_INT_BITS - bitoff);
        }
    }
}